

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O0

void __thiscall Meter::setValue(Meter *this,qreal v)

{
  double dVar1;
  bool bVar2;
  MeterPrivate *pMVar3;
  double dVar4;
  double local_28;
  double local_20;
  double local_18;
  qreal v_local;
  Meter *this_local;
  
  local_18 = v;
  v_local = (qreal)this;
  pMVar3 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->(&this->d);
  dVar4 = local_18;
  if (v < pMVar3->minValue || v == pMVar3->minValue) {
    pMVar3 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->
                       (&this->d);
    local_20 = dVar4 - pMVar3->minValue;
    dVar4 = qAbs<double>(&local_20);
    bVar2 = false;
    if (1e-06 <= dVar4) goto LAB_00113633;
  }
  dVar4 = local_18;
  pMVar3 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->(&this->d);
  dVar1 = local_18;
  bVar2 = true;
  if (pMVar3->maxValue <= dVar4) {
    pMVar3 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->
                       (&this->d);
    local_28 = dVar1 - pMVar3->maxValue;
    dVar4 = qAbs<double>(&local_28);
    bVar2 = dVar4 < 1e-06;
  }
LAB_00113633:
  dVar4 = local_18;
  if (bVar2) {
    pMVar3 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->
                       (&this->d);
    pMVar3->value = dVar4;
    QWidget::update();
    valueChanged(this,local_18);
    pMVar3 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->
                       (&this->d);
    bVar2 = MeterPrivate::thresholdFired(pMVar3);
    if (bVar2) {
      pMVar3 = QScopedPointer<MeterPrivate,_QScopedPointerDeleter<MeterPrivate>_>::operator->
                         (&this->d);
      thresholdFired(this,pMVar3->currentThreshold);
    }
  }
  return;
}

Assistant:

void
Meter::setValue( qreal v )
{
	if( ( v > d->minValue || qAbs( v - d->minValue ) < 0.000001 ) &&
		( v < d->maxValue || qAbs( v - d->maxValue ) < 0.000001 ) )
	{
		d->value = v;

		update();

		emit valueChanged( v );

		if( d->thresholdFired() )
			emit thresholdFired( d->currentThreshold );
	}
}